

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O2

bool __thiscall DIS::Sensor::operator==(Sensor *this,Sensor *rhs)

{
  return (this->_sensorOnOffStatus == rhs->_sensorOnOffStatus &&
         this->_sensorTypeSource == rhs->_sensorTypeSource) &&
         ((this->_station == rhs->_station && this->_sensorType == rhs->_sensorType) &&
         (this->_padding == rhs->_padding && rhs->_quantity == this->_quantity));
}

Assistant:

bool Sensor::operator ==(const Sensor& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_sensorTypeSource == rhs._sensorTypeSource) ) ivarsEqual = false;
     if( ! (_sensorOnOffStatus == rhs._sensorOnOffStatus) ) ivarsEqual = false;
     if( ! (_sensorType == rhs._sensorType) ) ivarsEqual = false;
     if( ! (_station == rhs._station) ) ivarsEqual = false;
     if( ! (_quantity == rhs._quantity) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }